

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.h
# Opt level: O0

void __thiscall
ASTAR::astarSearcher::astarSearcher<ASTAR::EuclidianHeuristics>
          (astarSearcher *this,ProbabilisticRoadMap *G_ptr,EuclidianHeuristics *heuristic,
          vertex_t start_vertex,vertex_t goal_vertex)

{
  iterator iVar1;
  astar_visitor *p;
  iterator iVar2;
  ostream *poVar3;
  undefined8 *in_RDX;
  int_type_conflict in_RSI;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  *in_RDI;
  vertex_t in_R8;
  bgl_named_params<ASTAR::astar_visitor,_boost::graph_visitor_t,_boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,_boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,_unsigned_long>,_float,_float_&>,_boost::vertex_distance_t,_boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::vertex_predecessor_t,_boost::no_property>_>_>
  *in_stack_00000058;
  EuclidianHeuristics *in_stack_00000060;
  vertex_descriptor in_stack_00000068;
  adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>
  *in_stack_00000070;
  vertex_t u;
  found_goal fg;
  astar_visitor vis;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
  *in_stack_fffffffffffffe28;
  astar_visitor *in_stack_fffffffffffffe30;
  vertex_index_t p_00;
  iterator_property_map<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,_boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,_unsigned_long>,_float,_float_&>
  *in_stack_fffffffffffffe38;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
  *in_stack_fffffffffffffe40;
  size_type in_stack_fffffffffffffe48;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe50;
  EuclidianHeuristics local_68;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_58;
  astar_visitor local_40;
  vertex_t local_28;
  undefined8 *local_18;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_10;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10.time_.time_count_.value_ = (time_rep_type)(time_rep_type)in_RSI;
  boost::posix_time::ptime::ptime((ptime *)in_stack_fffffffffffffe40);
  boost::posix_time::ptime::ptime((ptime *)in_stack_fffffffffffffe40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14f91b);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x14f931);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14f94a);
  *(undefined4 *)&in_RDI[2].time_ = 0;
  astar_visitor::astar_visitor(in_stack_fffffffffffffe30,(u_int32_t *)in_stack_fffffffffffffe28);
  p_00 = (vertex_index_t)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  astar_visitor::set_goal(&local_40,local_28);
  boost::
  num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::vecS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::listS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::vecS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::listS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>::config>>
            (in_stack_fffffffffffffe40);
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  boost::
  num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::vecS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::listS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::vecS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::listS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>::config>>
            (in_stack_fffffffffffffe40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48);
  in_RDI[0xc].time_ = local_10.time_.time_count_.value_;
  local_58.time_.time_count_.value_ =
       (time_rep_type)boost::date_time::microsec_clock<boost::posix_time::ptime>::local_time();
  in_RDI->time_ = local_58.time_.time_count_.value_;
  local_68.G_ptr = (ProbabilisticRoadMap *)*local_18;
  local_68.goal_vertex = local_18[1];
  iVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffe28);
  boost::
  get<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::vecS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::listS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::vecS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::listS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>::config>,boost::vertex_index_t>
            (p_00,in_stack_fffffffffffffe28);
  p = (astar_visitor *)
      boost::
      make_iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,unsigned_long>>
                (iVar1._M_current);
  boost::
  predecessor_map<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,unsigned_long>,unsigned_long,unsigned_long&>>
            ((iterator_property_map<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,_boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,_unsigned_long>,_float,_float_&>
              *)in_stack_fffffffffffffe40);
  iVar2 = std::vector<float,_std::allocator<float>_>::begin
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe28);
  boost::
  get<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::vecS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::listS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::vecS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::listS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>::config>,boost::vertex_index_t>
            (p_00,in_stack_fffffffffffffe28);
  boost::
  make_iterator_property_map<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,unsigned_long>>
            (iVar2._M_current);
  boost::
  bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,unsigned_long>,unsigned_long,unsigned_long&>,boost::vertex_predecessor_t,boost::no_property>
  ::
  distance_map<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,unsigned_long>,float,float&>>
            ((bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::vertex_predecessor_t,_boost::no_property>
              *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  boost::
  bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,_boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,_unsigned_long>,_float,_float_&>,_boost::vertex_distance_t,_boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::vertex_predecessor_t,_boost::no_property>_>
  ::visitor<ASTAR::astar_visitor>
            ((bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,_boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,_unsigned_long>,_float,_float_&>,_boost::vertex_distance_t,_boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::vertex_predecessor_t,_boost::no_property>_>
              *)local_10.time_.time_count_.value_,p);
  boost::
  astar_search<boost::adjacency_list<boost::listS,boost::vecS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>,ASTAR::EuclidianHeuristics,ASTAR::astar_visitor,boost::graph_visitor_t,boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,unsigned_long>,float,float&>,boost::vertex_distance_t,boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,unsigned_long>,unsigned_long,unsigned_long&>,boost::vertex_predecessor_t,boost::no_property>>>
            (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  EuclidianHeuristics::~EuclidianHeuristics(&local_68);
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"NO SOLUTION FOUND");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  *(undefined1 *)&in_RDI[0xd].time_ = 0;
  return;
}

Assistant:

astarSearcher(PRM::ProbabilisticRoadMap* G_ptr, Heuristic* heuristic, vertex_t start_vertex, vertex_t goal_vertex)
        {
            vertices_expanded=0;
            astar_visitor vis(&vertices_expanded);
            vis.set_goal(goal_vertex);
            cost.resize(boost::num_vertices(G_ptr->graph));
            predecessor.resize(boost::num_vertices(G_ptr->graph));
            prm = G_ptr;
            
            try
            {
                start_time = boost::posix_time::microsec_clock::local_time();
               // std::cout << std::endl << "Running Astar" << std::endl;
                boost::astar_search(G_ptr->graph, start_vertex, *heuristic,
                                    predecessor_map(make_iterator_property_map(predecessor.begin(), get(boost::vertex_index, G_ptr->graph))).
                                    distance_map(make_iterator_property_map(cost.begin(), get(boost::vertex_index, G_ptr->graph))).
                                    visitor(vis));
                //throw found_goal();
            }
            
            
            catch(found_goal fg)
            {
                path_found = true;
                stop_time = boost::posix_time::microsec_clock::local_time();
                // Walk backwards from the goal through the predecessor chain adding
                // vertices to the solution path.
                for (vertex_t u = goal_vertex; u != start_vertex; u = predecessor[u])
                {
                    shortest_path.push_back(u);
                }
                shortest_path.push_back(start_vertex);
                std::reverse(shortest_path.begin(),shortest_path.end());
                //std::cout << std::endl << "SHORTEST PATH FOUND" << std::endl;
                return;
                
            }
            
            std::cout << std::endl << "NO SOLUTION FOUND" << std::endl;
            path_found = false;
            
        }